

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void CalcWindowContentSizes
               (ImGuiWindow *window,ImVec2 *content_size_current,ImVec2 *content_size_ideal)

{
  bool bVar1;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  float fVar2;
  bool preserve_old_content_sizes;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  
  bVar1 = false;
  if ((((*(byte *)(in_RDI + 0x99) & 1) == 0) || ('\0' < *(char *)(in_RDI + 0xb0))) ||
     ('\0' < *(char *)(in_RDI + 0xb1))) {
    if ((((*(byte *)(in_RDI + 0x9d) & 1) != 0) && (*(char *)(in_RDI + 0xb9) == '\0')) &&
       ('\0' < *(char *)(in_RDI + 0xb8))) {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    *(undefined8 *)in_RSI = *(undefined8 *)(in_RDI + 0x30);
    *(undefined8 *)in_RDX = *(undefined8 *)(in_RDI + 0x38);
  }
  else {
    if ((*(float *)(in_RDI + 0x40) != 0.0) || (NAN(*(float *)(in_RDI + 0x40)))) {
      local_20 = *(float *)(in_RDI + 0x40);
    }
    else {
      local_20 = (float)(int)(*(float *)(in_RDI + 0xf8) - *(float *)(in_RDI + 0xf0));
    }
    *in_RSI = local_20;
    if ((*(float *)(in_RDI + 0x44) != 0.0) || (NAN(*(float *)(in_RDI + 0x44)))) {
      local_24 = *(float *)(in_RDI + 0x44);
    }
    else {
      local_24 = (float)(int)(*(float *)(in_RDI + 0xfc) - *(float *)(in_RDI + 0xf4));
    }
    in_RSI[1] = local_24;
    if ((*(float *)(in_RDI + 0x40) != 0.0) || (NAN(*(float *)(in_RDI + 0x40)))) {
      local_28 = *(float *)(in_RDI + 0x40);
    }
    else {
      fVar2 = ImMax<float>(*(float *)(in_RDI + 0xf8),*(float *)(in_RDI + 0x100));
      local_28 = (float)(int)(fVar2 - *(float *)(in_RDI + 0xf0));
    }
    *in_RDX = local_28;
    if ((*(float *)(in_RDI + 0x44) != 0.0) || (NAN(*(float *)(in_RDI + 0x44)))) {
      local_2c = *(float *)(in_RDI + 0x44);
    }
    else {
      fVar2 = ImMax<float>(*(float *)(in_RDI + 0xfc),*(float *)(in_RDI + 0x104));
      local_2c = (float)(int)(fVar2 - *(float *)(in_RDI + 0xf4));
    }
    in_RDX[1] = local_2c;
  }
  return;
}

Assistant:

static void CalcWindowContentSizes(ImGuiWindow* window, ImVec2* content_size_current, ImVec2* content_size_ideal)
{
    bool preserve_old_content_sizes = false;
    if (window->Collapsed && window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
        preserve_old_content_sizes = true;
    else if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        preserve_old_content_sizes = true;
    if (preserve_old_content_sizes)
    {
        *content_size_current = window->ContentSize;
        *content_size_ideal = window->ContentSizeIdeal;
        return;
    }

    content_size_current->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    content_size_current->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    content_size_ideal->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(ImMax(window->DC.CursorMaxPos.x, window->DC.IdealMaxPos.x) - window->DC.CursorStartPos.x);
    content_size_ideal->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(ImMax(window->DC.CursorMaxPos.y, window->DC.IdealMaxPos.y) - window->DC.CursorStartPos.y);
}